

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

float deqp::gles31::Functional::roundEven(float v)

{
  int iVar1;
  float fVar2;
  
  fVar2 = floorf(v);
  fVar2 = v - fVar2;
  iVar1 = (int)(v - fVar2);
  if (fVar2 <= 0.5) {
    iVar1 = iVar1 + (uint)((byte)iVar1 & fVar2 == 0.5);
  }
  else {
    iVar1 = iVar1 + 1;
  }
  return (float)iVar1;
}

Assistant:

static float roundEven (float v)
{
	const float		q			= deFloatFrac(v);
	const int		truncated	= int(v-q);
	const int		rounded		= (q > 0.5f)							? (truncated + 1) :	// Rounded up
									(q == 0.5f && (truncated % 2 != 0))	? (truncated + 1) :	// Round to nearest even at 0.5
									truncated;												// Rounded down

	return float(rounded);
}